

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

ptrdiff_t __thiscall pugi::xml_node::offset_debug(xml_node *this)

{
  xml_node_type xVar1;
  xml_document_struct *pxVar2;
  xml_node *local_40;
  xml_node *local_38;
  xml_document_struct *doc;
  xml_node *this_local;
  
  if (this->_root == (xml_node_struct *)0x0) {
    return -1;
  }
  pxVar2 = impl::anon_unknown_0::get_document<pugi::xml_node_struct>(this->_root);
  if ((pxVar2->buffer == (char_t *)0x0) || (pxVar2->extra_buffers != (xml_extra_buffer *)0x0)) {
    return -1;
  }
  xVar1 = type(this);
  if (xVar1 == node_document) {
    return 0;
  }
  if (xVar1 == node_element) {
LAB_0015084d:
    if ((this->_root->name == (char_t *)0x0) || ((this->_root->header & 0x60) != 0)) {
      local_38 = (xml_node *)0xffffffffffffffff;
    }
    else {
      local_38 = (xml_node *)(this->_root->name + -(long)pxVar2->buffer);
    }
    this_local = local_38;
  }
  else {
    if (2 < xVar1 - node_pcdata) {
      if (xVar1 - node_pi < 2) goto LAB_0015084d;
      if (xVar1 != node_doctype) {
        __assert_fail("false && \"Invalid node type\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                      ,0x18e9,"ptrdiff_t pugi::xml_node::offset_debug() const");
      }
    }
    if ((this->_root->value == (char_t *)0x0) || ((this->_root->header & 0x50) != 0)) {
      local_40 = (xml_node *)0xffffffffffffffff;
    }
    else {
      local_40 = (xml_node *)(this->_root->value + -(long)pxVar2->buffer);
    }
    this_local = local_40;
  }
  return (ptrdiff_t)this_local;
}

Assistant:

PUGI__FN ptrdiff_t xml_node::offset_debug() const
	{
		if (!_root) return -1;

		impl::xml_document_struct& doc = impl::get_document(_root);

		// we can determine the offset reliably only if there is exactly once parse buffer
		if (!doc.buffer || doc.extra_buffers) return -1;

		switch (type())
		{
		case node_document:
			return 0;

		case node_element:
		case node_declaration:
		case node_pi:
			return _root->name && (_root->header & impl::xml_memory_page_name_allocated_or_shared_mask) == 0 ? _root->name - doc.buffer : -1;

		case node_pcdata:
		case node_cdata:
		case node_comment:
		case node_doctype:
			return _root->value && (_root->header & impl::xml_memory_page_value_allocated_or_shared_mask) == 0 ? _root->value - doc.buffer : -1;

		default:
			assert(false && "Invalid node type"); // unreachable
			return -1;
		}
	}